

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::duplicate_contents(Tree *this,Tree *src,size_t node,size_t where)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  bool bVar5;
  size_t after;
  char msg [31];
  char local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  if (src == (Tree *)0x0) {
    builtin_strncpy(local_b8,"check failed: (src != nullptr)",0x1f);
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_48 = 0;
    uStack_40 = 0x65cf;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x65cf) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x65cf) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x1f,LVar2,(this->m_callbacks).m_user_data);
  }
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_b8,"check failed: (node != NONE)",0x1d);
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_70 = 0;
    uStack_68 = 0x65d0;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x65d0) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x65d0) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (where == 0xffffffffffffffff) {
    builtin_strncpy(local_b8,"check failed: (where != NONE)",0x1e);
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_98 = 0;
    uStack_90 = 0x65d1;
    local_88 = 0;
    pcStack_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x65d1) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x65d1) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_b8,0x1e,LVar4,(this->m_callbacks).m_user_data);
  }
  _copy_props_wo_key(this,where,src,node);
  after = last_child(this,where);
  duplicate_children(this,src,node,where,after);
  return;
}

Assistant:

void Tree::duplicate_contents(Tree const *src, size_t node, size_t where)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, where != NONE);
    _copy_props_wo_key(where, src, node);
    duplicate_children(src, node, where, last_child(where));
}